

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManSetCioIds(Aig_Man_t *p)

{
  int iVar1;
  int *piVar2;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vCis), local_1c < iVar1; local_1c = local_1c + 1) {
    piVar2 = (int *)Vec_PtrEntry(p->vCis,local_1c);
    *piVar2 = local_1c;
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vCos), local_1c < iVar1; local_1c = local_1c + 1) {
    piVar2 = (int *)Vec_PtrEntry(p->vCos,local_1c);
    *piVar2 = local_1c;
  }
  return;
}

Assistant:

void Aig_ManSetCioIds( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachCi( p, pObj, i )
        pObj->CioId = i;
    Aig_ManForEachCo( p, pObj, i )
        pObj->CioId = i;
}